

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O1

void __thiscall
myvk::CommandBuffer::CmdGenerateMipmap2D
          (CommandBuffer *this,Ptr<ImageBase> *image,VkPipelineStageFlags src_stage,
          VkPipelineStageFlags dst_stage,VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask
          ,VkImageLayout old_layout,VkImageLayout new_layout)

{
  ImageBase *pIVar1;
  VkImage pVVar2;
  uint32_t uVar3;
  VkAccessFlags VVar4;
  ImageBase *this_00;
  VkImageLayout old_layout_00;
  uint32_t uVar5;
  VkPipelineStageFlags VVar6;
  uint uVar7;
  uint uVar8;
  initializer_list<VkImageSubresourceLayers> __l;
  initializer_list<VkImageSubresourceLayers> __l_00;
  initializer_list<VkImageSubresourceLayers> __l_01;
  initializer_list<VkImageSubresourceLayers> __l_02;
  initializer_list<VkImageSubresourceLayers> __l_03;
  allocator_type local_109;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_108;
  VkPipelineStageFlags local_ec;
  VkAccessFlags local_e8;
  VkAccessFlags local_e4;
  CommandBuffer *local_e0;
  vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> local_d8;
  VkPipelineStageFlags local_bc;
  undefined1 local_b8 [28];
  uint32_t local_9c;
  undefined1 local_98 [16];
  pointer local_88;
  long lStack_80;
  uint32_t uStack_78;
  uint32_t uStack_74;
  VkImageSubresourceLayers VStack_70;
  undefined1 auStack_60 [16];
  uint uStack_50;
  uint32_t uStack_4c;
  uint local_48;
  uint32_t uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pIVar1 = (image->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_ec = dst_stage;
  local_e8 = dst_access_mask;
  local_e4 = src_access_mask;
  local_e0 = this;
  local_bc = src_stage;
  if (pIVar1->m_mip_levels == 1) {
    local_d8.super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = pIVar1->m_array_layers;
    local_d8.super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
    local_d8.super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_d8;
    std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
              ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
               &local_108,__l,(allocator_type *)local_b8);
    ImageBase::GetMemoryBarriers
              ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)local_98,
               pIVar1,(vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *
                      )&local_108,local_e4,local_e8,old_layout,new_layout,0xffffffff,0xffffffff);
    (*vkCmdPipelineBarrier)
              (local_e0->m_command_buffer,local_bc,local_ec,0,0,(VkMemoryBarrier *)0x0,0,
               (VkBufferMemoryBarrier *)0x0,
               (int)((ulong)(local_98._8_8_ - local_98._0_8_) >> 3) * 0x38e38e39,
               (VkImageMemoryBarrier *)local_98._0_8_);
    if ((VkImageMemoryBarrier *)local_98._0_8_ != (VkImageMemoryBarrier *)0x0) {
      operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
    }
    if (local_108.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_start != (VkImageMemoryBarrier *)0x0) {
      operator_delete(local_108.
                      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.
                            super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.
                            super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    this_00 = (image->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (1 < this_00->m_mip_levels) {
      local_48 = (pIVar1->m_extent).width;
      uStack_44 = (pIVar1->m_extent).height;
      uStack_40 = 0;
      uStack_3c = 0;
      uVar5 = 0;
      do {
        local_9c = uVar5 + 1;
        local_88 = (pointer)0x0;
        local_98._4_4_ = uVar5;
        local_98._0_4_ = 1;
        local_98._8_8_ = (ulong)this_00->m_array_layers << 0x20;
        lStack_80 = (ulong)local_48 << 0x20;
        uStack_74 = (this_00->m_extent).depth;
        uStack_78 = uStack_44;
        uVar7 = -(uint)(1 < (int)local_48 / 2);
        uVar8 = -(uint)(1 < (int)uStack_44 / 2);
        uStack_40 = (int)uStack_40 / 2 & -(uint)(0 < (int)uStack_40 / 2);
        uStack_3c = (int)uStack_3c / 2 & -(uint)(0 < (int)uStack_3c / 2);
        local_48 = ~uVar7 & 1 | (int)local_48 / 2 & uVar7;
        uStack_44 = ~uVar8 & 1 | (int)uStack_44 / 2 & uVar8;
        auStack_60._0_4_ = 0;
        auStack_60._4_4_ = 0;
        auStack_60._8_8_ = (ulong)local_48 << 0x20;
        uStack_4c = (this_00->m_extent).depth;
        uStack_50 = uStack_44;
        VStack_70.mipLevel = local_9c;
        VStack_70.aspectMask = 1;
        VStack_70._8_8_ = (ulong)this_00->m_array_layers << 0x20;
        VVar6 = 0x1000;
        if (uVar5 == 0) {
          VVar6 = local_bc;
        }
        local_b8._0_8_ = local_98._0_8_;
        local_b8._8_8_ = local_98._8_8_;
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)local_b8;
        std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                  (&local_d8,__l_00,&local_109);
        VVar4 = 0x1000;
        if (uVar5 == 0) {
          VVar4 = local_e4;
        }
        old_layout_00 = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
        if (uVar5 == 0) {
          old_layout_00 = old_layout;
        }
        ImageBase::GetMemoryBarriers
                  (&local_108,this_00,&local_d8,VVar4,0x800,old_layout_00,
                   VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,0xffffffff,0xffffffff);
        (*vkCmdPipelineBarrier)
                  (local_e0->m_command_buffer,VVar6,0x1000,0,0,(VkMemoryBarrier *)0x0,0,
                   (VkBufferMemoryBarrier *)0x0,
                   (int)((ulong)((long)local_108.
                                       super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_108.
                                      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,
                   local_108.
                   super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        if (local_108.
            super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
            super__Vector_impl_data._M_start != (VkImageMemoryBarrier *)0x0) {
          operator_delete(local_108.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_108.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d8.
            super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.
                          super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.
                                super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.
                                super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pIVar1 = (image->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_b8._0_4_ = VStack_70.aspectMask;
        local_b8._4_4_ = VStack_70.mipLevel;
        local_b8._8_4_ = VStack_70.baseArrayLayer;
        local_b8._12_4_ = VStack_70.layerCount;
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)local_b8;
        std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                  (&local_d8,__l_01,&local_109);
        VVar4 = 0;
        if (uVar5 == 0) {
          VVar4 = local_e4;
        }
        ImageBase::GetMemoryBarriers
                  (&local_108,pIVar1,&local_d8,VVar4,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
                   VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0xffffffff,0xffffffff);
        (*vkCmdPipelineBarrier)
                  (local_e0->m_command_buffer,VVar6,0x1000,0,0,(VkMemoryBarrier *)0x0,0,
                   (VkBufferMemoryBarrier *)0x0,
                   (int)((ulong)((long)local_108.
                                       super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_108.
                                      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,
                   local_108.
                   super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        if (local_108.
            super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
            super__Vector_impl_data._M_start != (VkImageMemoryBarrier *)0x0) {
          operator_delete(local_108.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_108.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar3 = local_9c;
        if (local_d8.
            super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.
                          super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.
                                super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.
                                super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pVVar2 = ((image->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 m_image;
        (*vkCmdBlitImage)(local_e0->m_command_buffer,pVVar2,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                          pVVar2,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,1,(VkImageBlit *)local_98,
                          VK_FILTER_LINEAR);
        pIVar1 = (image->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_b8._0_8_ = local_98._0_8_;
        local_b8._8_8_ = local_98._8_8_;
        __l_02._M_len = 1;
        __l_02._M_array = (iterator)local_b8;
        std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                  (&local_d8,__l_02,&local_109);
        ImageBase::GetMemoryBarriers
                  (&local_108,pIVar1,&local_d8,0,local_e8,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                   new_layout,0xffffffff,0xffffffff);
        (*vkCmdPipelineBarrier)
                  (local_e0->m_command_buffer,0x1000,local_ec,0,0,(VkMemoryBarrier *)0x0,0,
                   (VkBufferMemoryBarrier *)0x0,
                   (int)((ulong)((long)local_108.
                                       super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_108.
                                      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,
                   local_108.
                   super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        if (local_108.
            super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
            super__Vector_impl_data._M_start != (VkImageMemoryBarrier *)0x0) {
          operator_delete(local_108.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_108.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d8.
            super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.
                          super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.
                                super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.
                                super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pIVar1 = (image->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (uVar3 == pIVar1->m_mip_levels - 1) {
          local_b8._0_4_ = VStack_70.aspectMask;
          local_b8._4_4_ = VStack_70.mipLevel;
          local_b8._8_4_ = VStack_70.baseArrayLayer;
          local_b8._12_4_ = VStack_70.layerCount;
          __l_03._M_len = 1;
          __l_03._M_array = (iterator)local_b8;
          std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                    (&local_d8,__l_03,&local_109);
          ImageBase::GetMemoryBarriers
                    (&local_108,pIVar1,&local_d8,0x1000,local_e8,
                     VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,new_layout,0xffffffff,0xffffffff);
          (*vkCmdPipelineBarrier)
                    (local_e0->m_command_buffer,0x1000,local_ec,0,0,(VkMemoryBarrier *)0x0,0,
                     (VkBufferMemoryBarrier *)0x0,
                     (int)((ulong)((long)local_108.
                                         super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_108.
                                        super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     0x38e38e39,
                     local_108.
                     super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          if (local_108.
              super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
              _M_impl.super__Vector_impl_data._M_start != (VkImageMemoryBarrier *)0x0) {
            operator_delete(local_108.
                            super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_108.
                                  super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_108.
                                  super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_d8.
              super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.
                            super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_d8.
                                  super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.
                                  super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        this_00 = (image->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        uVar7 = uVar5 + 2;
        uVar5 = uVar3;
      } while (uVar7 < this_00->m_mip_levels);
    }
  }
  return;
}

Assistant:

void CommandBuffer::CmdGenerateMipmap2D(const Ptr<ImageBase> &image, VkPipelineStageFlags src_stage,
                                        VkPipelineStageFlags dst_stage, VkAccessFlags src_access_mask,
                                        VkAccessFlags dst_access_mask, VkImageLayout old_layout,
                                        VkImageLayout new_layout) const {
	if (image->GetMipLevels() == 1) {
		VkImageSubresourceLayers subresource = {};
		subresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
		subresource.mipLevel = 0;
		subresource.baseArrayLayer = 0;
		subresource.layerCount = image->GetArrayLayers();
		CmdPipelineBarrier(
		    src_stage, dst_stage, {}, {},
		    image->GetMemoryBarriers({subresource}, src_access_mask, dst_access_mask, old_layout, new_layout));
		return;
	}
	auto mip_width = (int32_t)image->GetExtent().width, mip_height = (int32_t)image->GetExtent().height;
	for (uint32_t i = 1; i < image->GetMipLevels(); ++i) {
		VkImageBlit blit{};
		blit.srcOffsets[0] = {0, 0, 0};
		blit.srcOffsets[1] = {mip_width, mip_height, (int32_t)image->GetExtent().depth};
		blit.srcSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
		blit.srcSubresource.mipLevel = i - 1;
		blit.srcSubresource.baseArrayLayer = 0;
		blit.srcSubresource.layerCount = image->GetArrayLayers();
		mip_width = std::max(mip_width / 2, 1);
		mip_height = std::max(mip_height / 2, 1);
		blit.dstOffsets[0] = {0, 0, 0};
		blit.dstOffsets[1] = {mip_width, mip_height, (int32_t)image->GetExtent().depth};
		blit.dstSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
		blit.dstSubresource.mipLevel = i;
		blit.dstSubresource.baseArrayLayer = 0;
		blit.dstSubresource.layerCount = image->GetArrayLayers();

		CmdPipelineBarrier(i == 1 ? src_stage : VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
		                   image->GetMemoryBarriers(
		                       {blit.srcSubresource}, i == 1 ? src_access_mask : VK_ACCESS_TRANSFER_WRITE_BIT,
		                       VK_ACCESS_TRANSFER_READ_BIT, i == 1 ? old_layout : VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
		                       VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL));
		CmdPipelineBarrier(i == 1 ? src_stage : VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
		                   image->GetMemoryBarriers({blit.dstSubresource}, i == 1 ? src_access_mask : 0,
		                                            VK_ACCESS_TRANSFER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED,
		                                            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL));

		CmdBlitImage(image, image, blit, VK_FILTER_LINEAR);

		CmdPipelineBarrier(VK_PIPELINE_STAGE_TRANSFER_BIT, dst_stage, {}, {},
		                   image->GetMemoryBarriers({blit.srcSubresource}, 0, dst_access_mask,
		                                            VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, new_layout));
		if (i == image->GetMipLevels() - 1) {
			CmdPipelineBarrier(VK_PIPELINE_STAGE_TRANSFER_BIT, dst_stage, {}, {},
			                   image->GetMemoryBarriers({blit.dstSubresource}, VK_ACCESS_TRANSFER_WRITE_BIT,
			                                            dst_access_mask, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			                                            new_layout));
		}
	}
}